

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O3

bool renderKeyPresses(stStateUI *stateUI,TWaveform *waveform,TKeyPressCollection *keyPresses)

{
  pointer *ppsVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  pointer psVar5;
  iterator __position;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 graph_size;
  ImVec2 graph_size_00;
  ImVec2 graph_size_01;
  ImVec2 graph_size_02;
  ImVec2 graph_size_03;
  byte bVar8;
  float *pfVar9;
  float *pfVar10;
  TKeyPressCollection *pTVar11;
  uint uVar12;
  bool bVar13;
  int iVar14;
  ImU32 IVar15;
  uint uVar16;
  uint uVar17;
  ImGuiIO *pIVar18;
  const_iterator __position_00;
  pointer psVar19;
  ImDrawList *pIVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  pointer psVar24;
  int iVar25;
  long lVar26;
  ImVec2 *pIVar27;
  pointer __src;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  int *piVar33;
  int *piVar34;
  long lVar35;
  uint __len;
  float fVar36;
  float fVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar38;
  float fVar39;
  ImVec2 wsize;
  ImVec2 savePos;
  ImVec2 p1;
  ImVec2 p0;
  stWaveformView<short> tview;
  ImVec2 savePos2;
  stWaveformView<short> wview;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  int *local_140;
  ImVec4 local_138;
  float local_120;
  undefined4 local_11c;
  undefined1 local_118 [8];
  int64_t iStack_110;
  long local_108;
  TValueCC TStack_100;
  undefined8 local_f8;
  TKey TStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  undefined1 local_d8 [24];
  float *local_c0;
  ImVec2 *local_b8;
  float *local_b0;
  ImDrawList *local_a8;
  ImVec2 local_a0;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  TKeyPressCollection *local_70;
  ImVec2 local_68;
  long local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  long local_38;
  
  piVar33 = &stateUI->nview;
  piVar34 = &stateUI->offset;
  iVar25 = stateUI->nview;
  if (iVar25 < 0) {
    iVar25 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
    *piVar33 = iVar25;
  }
  if (*piVar34 < 0) {
    *piVar34 = (int)(((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 1) - (long)iVar25 >>
                    1);
  }
  iVar14 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 1);
  if ((stateUI->scrolling == false & iVar25 < 0x80000 & stateUI->recording) == 1) {
    iVar25 = 0x80000;
    if (iVar14 < 0x80000) {
      iVar25 = iVar14;
    }
    *piVar33 = iVar25;
  }
  if (stateUI->lastSize != iVar14) {
    stateUI->viewMax = iVar14;
    stateUI->lastSize = iVar14;
    stateUI->nviewPrev = iVar25 + 1;
    if (stateUI->scrolling == false) {
      *piVar34 = iVar14 - iVar25;
    }
  }
  iVar25 = (int)((ulong)((long)(keyPresses->
                               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                               ).
                               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(keyPresses->
                              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              ).
                              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  iVar14 = iVar25 * -0x55555555;
  iVar21 = stateUI->lastKeyPresses + 10;
  if (iVar21 == iVar14 || SBORROW4(iVar21,iVar14) != iVar21 + iVar25 * 0x55555555 < 0) {
    stateUI->lastKeyPresses = iVar14;
    std::
    vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
    ::_M_erase_at_end(&stateUI->similarityMap,
                      (stateUI->similarityMap).
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    stateUI->doUpdate = true;
    (stateUI->flags).recalculateSimilarityMap = true;
  }
  local_118 = (undefined1  [8])((ulong)(uint)stateUI->windowHeightTitleBar << 0x20);
  local_40.x = 0.0;
  local_40.y = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_118,2,&local_40);
  local_118._4_4_ = stateUI->windowHeightKeyPesses;
  if (((float)local_118._4_4_ != 0.0) || (NAN((float)local_118._4_4_))) {
    local_118._0_4_ = (float)g_windowSizeX;
  }
  else {
    local_118._4_4_ = 250.0;
    local_118._0_4_ = (float)g_windowSizeX;
  }
  ImGui::SetNextWindowSize((ImVec2 *)local_118,1);
  bVar13 = ImGui::Begin("Key Presses",(bool *)0x0,4);
  if (bVar13) {
    IVar6 = ImGui::GetContentRegionAvail();
    local_d8._8_4_ = extraout_XMM0_Dc;
    local_d8._0_4_ = IVar6.x;
    local_d8._4_4_ = IVar6.y;
    local_d8._12_4_ = extraout_XMM0_Dd;
    IVar6 = ImGui::GetContentRegionAvail();
    local_88 = IVar6.y;
    fStack_84 = local_88;
    fStack_80 = local_88;
    fStack_7c = local_88;
    fVar36 = ImGui::GetTextLineHeightWithSpacing();
    local_158.y = fVar36 * -3.0 + local_88;
    local_158.x = (float)local_d8._0_4_;
    iVar25 = stateUI->nview;
    local_140 = piVar33;
    local_e0 = piVar34;
    local_70 = keyPresses;
    if (iVar25 != stateUI->nviewPrev) {
      fVar36 = (float)iVar25 / (float)local_d8._0_4_;
      if (fVar36 <= 1.0) {
        fVar36 = 1.0;
      }
      local_118 = (undefined1  [8])
                  (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      iStack_110 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)local_118 >> 1;
      generateLowResWaveform<short>
                ((TWaveformViewT<short> *)local_118,&stateUI->waveformLowRes,(int)fVar36);
      iVar25 = stateUI->nview;
      stateUI->nviewPrev = iVar25;
    }
    local_b0 = &stateUI->amin;
    local_c0 = &stateUI->amax;
    local_40 = (ImVec2)((stateUI->waveformLowRes).super__Vector_base<short,_std::allocator<short>_>.
                        _M_impl.super__Vector_impl_data._M_start + stateUI->offset);
    local_38 = (long)iVar25;
    pIVar18 = ImGui::GetIO();
    local_d8._0_4_ = (pIVar18->MousePos).x;
    local_88 = (pIVar18->MousePos).y;
    local_150 = ImGui::GetCursorScreenPos();
    local_a8 = ImGui::GetWindowDrawList();
    local_118._0_4_ = 0.3;
    local_118._4_4_ = 0.3;
    iStack_110 = 0x3e99999a3e99999a;
    ImGui::PushStyleColor(7,(ImVec4 *)local_118);
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 1.0;
    iStack_110 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_118);
    IVar6.y = local_158.y;
    IVar6.x = local_158.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveform,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,IVar6);
    ImGui::PopStyleColor(2);
    ImGui::SetCursorScreenPos(&local_150);
    local_118._0_4_ = 0.1;
    local_118._4_4_ = 0.1;
    iStack_110 = 0x3dcccccd;
    ImGui::PushStyleColor(7,(ImVec4 *)local_118);
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 1.0;
    iStack_110 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_118);
    graph_size.y = local_158.y;
    graph_size.x = local_158.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveformInverse,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,graph_size);
    ImGui::PopStyleColor(2);
    uVar22 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    psVar4 = (stateUI->waveformThreshold).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar33 = local_140;
    if ((uVar22 == (long)(stateUI->waveformThreshold).
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar4) &&
       (psVar5 = (stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start,
       uVar22 == (long)(stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)psVar5)) {
      iStack_110 = (int64_t)*local_140;
      local_118 = (undefined1  [8])(psVar4 + *local_e0);
      local_68 = (ImVec2)(psVar5 + *local_e0);
      local_60 = iStack_110;
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 1.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      pfVar10 = local_b0;
      graph_size_00.y = local_158.y;
      graph_size_00.x = local_158.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveform,local_118,*local_140,0,"",*local_b0,
                       *local_c0,graph_size_00);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 1.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      pfVar9 = local_c0;
      graph_size_01.y = local_158.y;
      graph_size_01.x = local_158.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveformInverse,local_118,*local_140,0,"",*pfVar10,
                       *local_c0,graph_size_01);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      piVar33 = local_140;
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 0.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      graph_size_02.y = local_158.y;
      graph_size_02.x = local_158.x;
      ImGui::PlotLines("##WaveformMax",plotWaveform,&local_68,*piVar33,0,"",*pfVar10,*pfVar9,
                       graph_size_02);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_150);
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_138.w = 0.0;
      ImGui::PushStyleColor(7,&local_138);
      local_138.x = 0.0;
      local_138.y = 1.0;
      local_138.z = 0.0;
      local_138.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_138);
      uVar22 = (ulong)(uint)*piVar33;
      graph_size_03.y = local_158.y;
      graph_size_03.x = local_158.x;
      ImGui::PlotLines("##WaveformMax",plotWaveformInverse,&local_68,*piVar33,0,"",*pfVar10,*pfVar9,
                       graph_size_03);
      ImGui::PopStyleColor(2);
    }
    ImGui::SetCursorScreenPos(&local_150);
    ImGui::InvisibleButton("##WaveformIB",&local_158);
    bVar13 = ImGui::IsItemHovered(0);
    pTVar11 = local_70;
    local_11c = (undefined4)CONCAT71((int7)(uVar22 >> 8),1);
    if (bVar13) {
      pIVar18 = ImGui::GetIO();
      fVar36 = pIVar18->MouseWheel;
      iVar25 = stateUI->nview;
      iVar14 = (int)((float)iVar25 * ((fVar36 + 10.0) / 10.0));
      if (iVar14 < stateUI->viewMin) {
        iVar14 = stateUI->viewMin;
      }
      if (stateUI->viewMax < iVar14) {
        iVar14 = stateUI->viewMax;
      }
      stateUI->nview = iVar14;
      if ((fVar36 != 0.0) || (NAN(fVar36))) {
        fVar36 = (float)(iVar25 - iVar14) * (((float)local_d8._0_4_ - local_150.x) / local_158.x) +
                 (float)*local_e0;
        if (fVar36 <= 0.0) {
          fVar36 = 0.0;
        }
        *local_e0 = (int)fVar36;
      }
      bVar13 = ImGui::IsMouseDown(0);
      if ((bVar13) && (bVar13 = ImGui::IsMouseDragging(0,-1.0), !bVar13)) {
        stateUI->dragOffset = (float)stateUI->offset;
      }
      bVar13 = ImGui::IsMouseDragging(0,-1.0);
      if (bVar13) {
        local_120 = stateUI->dragOffset;
        IVar6 = ImGui::GetMouseDragDelta(0,-1.0);
        stateUI->offset = (int)(local_120 - ((float)stateUI->nview * IVar6.x) / local_158.x);
      }
      bVar13 = ImGui::IsMouseReleased(0);
      if (((bVar13) && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)) ||
         (bVar13 = ImGui::IsMouseDoubleClicked(0), bVar13)) {
        lVar23 = (long)((((float)local_d8._0_4_ - local_150.x) * (float)*piVar33) / local_158.x +
                       (float)*local_e0);
        __position_00._M_current =
             (pTVar11->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
             .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        __position._M_current =
             (pTVar11->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
             .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        uVar22 = ((long)__position._M_current - (long)__position_00._M_current >> 4) *
                 -0x5555555555555555;
        uVar31 = (uint)uVar22;
        if ((int)uVar31 < 1) {
          uVar17 = 0;
        }
        else {
          lVar29 = (long)(stateUI->params).keyPressWidth_samples;
          uVar28 = 0;
          do {
            lVar26 = (__position_00._M_current)->pos;
            lVar35 = lVar26 + (stateUI->params).offsetFromPeak_samples;
            lVar30 = lVar35 - lVar29;
            lVar35 = lVar35 + lVar29;
            lVar32 = lVar26;
            if (lVar30 < lVar26) {
              lVar32 = lVar30;
            }
            if (lVar35 < lVar32) {
              lVar32 = lVar35;
            }
            if (lVar23 < lVar32) {
              TStack_100 = 0.0;
              local_f8._0_4_ = -1;
              local_f8._4_4_ = -1;
              TStack_f0 = 0x3f;
              local_118 = (undefined1  [8])
                          (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                          super__Vector_impl_data._M_start;
              iStack_110 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)local_118 >> 1;
              local_108 = lVar23;
              std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::insert
                        (&pTVar11->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ,__position_00,(value_type *)local_118);
              local_11c = 0;
              piVar33 = local_140;
              goto LAB_00131de4;
            }
            if (lVar30 < lVar26) {
              lVar30 = lVar26;
            }
            if (lVar30 <= lVar35) {
              lVar30 = lVar35;
            }
            if (lVar23 <= lVar30) goto LAB_00131cfe;
            uVar28 = uVar28 + 1;
            __position_00._M_current = __position_00._M_current + 1;
          } while ((uVar31 & 0x7fffffff) != uVar28);
          uVar28 = uVar22 & 0xffffffff;
LAB_00131cfe:
          uVar17 = (uint)uVar28;
          piVar33 = local_140;
        }
        if (uVar17 == uVar31) {
          TStack_100 = 0.0;
          local_f8._0_4_ = -1;
          local_f8._4_4_ = -1;
          TStack_f0 = 0x3f;
          local_118 = (undefined1  [8])
                      (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          iStack_110 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)local_118 >> 1;
          if (__position._M_current ==
              (pTVar11->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
              ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_108 = lVar23;
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>const&>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)
                       pTVar11,__position,(stKeyPressData<short> *)local_118);
          }
          else {
            (__position._M_current)->cid = -1;
            (__position._M_current)->bind = -1;
            *(ulong *)&(__position._M_current)->predicted = CONCAT44(uStack_ec,0x3f);
            (__position._M_current)->pos = lVar23;
            (__position._M_current)->ccAvg = 0.0;
            ((__position._M_current)->waveform).samples = (short *)local_118;
            ((__position._M_current)->waveform).n = iStack_110;
            ppsVar1 = &(pTVar11->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
            local_108 = lVar23;
          }
          local_11c = 0;
        }
      }
    }
LAB_00131de4:
    bVar13 = ImGui::BeginPopupContextWindow((char *)0x0,1,true);
    if (bVar13) {
      ImGui::SliderInt("View  ",piVar33,stateUI->viewMin,stateUI->viewMax,"%d");
      ImGui::DragInt("Offset",local_e0,(float)stateUI->nview * 0.01,0,
                     (int)((ulong)((long)(waveform->
                                         super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(waveform->super__Vector_base<short,_std::allocator<short>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 1) -
                     stateUI->nview,"%d");
      ImGui::SliderFloat("Amplitude Min",local_b0,-32000.0,0.0,"%.3f",1.0);
      ImGui::SliderFloat("Amplitude Max",local_c0,0.0,32000.0,"%.3f",1.0);
      ImGui::EndPopup();
    }
    local_118._4_4_ = stateUI->scrollSize;
    local_118._0_4_ = local_158.x;
    ImGui::InvisibleButton("##WaveformScrollIB",(ImVec2 *)local_118);
    local_68.y = local_150.y + local_158.y;
    local_68.x = local_150.x;
    local_138.y = stateUI->scrollSize + local_150.y + local_158.y;
    local_138.x = local_158.x + local_150.x;
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 1.0;
    iStack_110 = 0x3f8000003f800000;
    IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
    pIVar20 = local_a8;
    ImDrawList::AddRect(local_a8,&local_68,(ImVec2 *)&local_138,IVar15,0.0,0xf,1.0);
    uVar2 = stateUI->nview;
    uVar3 = stateUI->offset;
    fVar36 = local_158.y + local_150.y;
    local_68.y = fVar36;
    local_68.x = (local_158.x * (float)(int)uVar3) / (float)stateUI->viewMax + local_150.x;
    local_138.y = stateUI->scrollSize + fVar36;
    local_138.x = (((float)(int)uVar3 + (float)(int)uVar2) * local_158.x) / (float)stateUI->viewMax
                  + local_150.x;
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 1.0;
    iStack_110 = 0x3f8000003f800000;
    IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
    ImDrawList::AddRectFilled(pIVar20,&local_68,(ImVec2 *)&local_138,IVar15,0.0,0xf);
    local_68 = ImGui::GetCursorScreenPos();
    bVar13 = ImGui::IsItemHovered(0);
    if ((bVar13) && (bVar13 = ImGui::IsMouseDown(0), bVar13)) {
      stateUI->scrolling = true;
    }
    pTVar11 = local_70;
    piVar33 = local_e0;
    if (stateUI->scrolling == true) {
      stateUI->offset =
           (int)((float)stateUI->viewMax * (((float)local_d8._0_4_ - local_150.x) / local_158.x) -
                (float)(stateUI->nview / 2));
    }
    local_b8 = (ImVec2 *)waveform;
    bVar13 = ImGui::IsMouseDown(0);
    if (!bVar13) {
      stateUI->scrolling = false;
    }
    iVar14 = (int)((ulong)((long)local_b8[1] - (long)*local_b8) >> 1) - *local_140;
    iVar25 = *piVar33;
    if (iVar25 <= iVar14) {
      iVar14 = iVar25;
    }
    iVar25 = 0;
    if (0 < iVar14) {
      iVar25 = iVar14;
    }
    *piVar33 = iVar25;
    psVar19 = (pTVar11->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
              ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    psVar24 = (pTVar11->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
              ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)psVar24 - (long)psVar19) >> 4) * -0x55555555) {
      uVar31 = 0;
      pIVar20 = local_a8;
      piVar33 = local_140;
      do {
        lVar23 = (long)(stateUI->params).offsetFromPeak_samples + psVar19[(int)uVar31].pos;
        lVar29 = (long)(stateUI->params).keyPressWidth_samples;
        iVar25 = stateUI->offset;
        if ((long)iVar25 <= lVar23 + lVar29) {
          if ((long)(*piVar33 + iVar25) <= lVar23 - lVar29) {
            iVar25 = (int)((ulong)((long)psVar24 - (long)psVar19) >> 4) * -0x55555555;
            break;
          }
          local_138.x = ((float)(psVar19[(int)uVar31].pos - (long)iVar25) / (float)*piVar33) *
                        local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_148.y = local_150.y + local_158.y;
          local_148.x = local_138.x;
          local_118._0_4_ = 1.0;
          local_118._4_4_ = 0.0;
          iStack_110 = 0x3f4ccccd00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
          ImDrawList::AddLine(pIVar20,(ImVec2 *)&local_138,&local_148,IVar15,1.0);
          lVar23 = (pTVar11->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar31].pos;
          lVar35 = (long)stateUI->offset;
          lVar26 = (stateUI->params).offsetFromPeak_samples + lVar23;
          fVar36 = (float)stateUI->nview;
          lVar29 = (long)(stateUI->params).keyPressWidth_samples;
          fVar38 = (float)(lVar26 - (lVar29 + lVar35)) / fVar36;
          fVar39 = (float)((lVar29 - lVar35) + lVar26) / fVar36;
          fVar37 = ((float)(lVar23 - lVar35) / fVar36) * local_158.x + local_150.x;
          local_c0 = (float *)CONCAT44(local_c0._4_4_,fVar38);
          local_138.x = fVar38 * local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_b0 = (float *)CONCAT44(local_b0._4_4_,fVar39);
          local_148.x = local_158.x * fVar39 + local_150.x;
          local_148.y = local_158.y + local_150.y;
          fVar36 = local_138.x;
          if (fVar37 <= local_138.x) {
            fVar36 = fVar37;
          }
          fVar38 = local_148.x;
          if (fVar36 <= local_148.x) {
            fVar38 = fVar36;
          }
          if ((float)local_d8._0_4_ <= fVar38) {
LAB_00132359:
            local_118._0_4_ = 1.0;
            local_118._4_4_ = 0.0;
            iStack_110 = 0x3e99999a00000000;
            IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
            ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&local_138,&local_148,IVar15,0.0,0xf);
          }
          else {
            fVar36 = local_138.x;
            if (local_138.x <= fVar37) {
              fVar36 = fVar37;
            }
            fVar37 = local_148.x;
            if (local_148.x <= fVar36) {
              fVar37 = fVar36;
            }
            if ((fVar37 <= (float)local_d8._0_4_) || (local_88 <= local_150.y)) goto LAB_00132359;
            local_118._0_4_ = 1.0;
            local_118._4_4_ = 0.0;
            iStack_110 = (ulong)*(uint *)(&DAT_00197280 + (ulong)(local_88 < local_148.y) * 4) <<
                         0x20;
            local_120 = local_148.y;
            IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
            ImDrawList::AddRectFilled(pIVar20,(ImVec2 *)&local_138,&local_148,IVar15,0.0,0xf);
            if (local_88 < local_120) {
              bVar13 = ImGui::IsMouseReleased(0);
              if ((bVar13) && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)) {
                bVar8 = (byte)local_11c;
              }
              else {
                bVar13 = ImGui::IsMouseDoubleClicked(0);
                bVar8 = (byte)local_11c & bVar13;
              }
              if (bVar8 != 0) {
                psVar24 = (pTVar11->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar19 = (pTVar11->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                __src = psVar24 + (long)(int)uVar31 + 1;
                if (__src != psVar19) {
                  memmove(psVar24 + (int)uVar31,__src,(long)psVar19 - (long)__src);
                  psVar19 = (pTVar11->
                            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            ).
                            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                (pTVar11->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = psVar19 + -1;
                uVar31 = uVar31 - 1;
              }
            }
          }
          uVar17 = *piVar33;
          if ((float)(int)uVar17 < local_158.x * 64.0) {
            local_120 = local_158.x;
            uVar17 = -uVar31;
            if (0 < (int)uVar31) {
              uVar17 = uVar31;
            }
            __len = 1;
            if (9 < uVar17) {
              uVar22 = (ulong)uVar17;
              uVar12 = 4;
              do {
                __len = uVar12;
                uVar16 = (uint)uVar22;
                if (uVar16 < 100) {
                  __len = __len - 2;
                  goto LAB_00132461;
                }
                if (uVar16 < 1000) {
                  __len = __len - 1;
                  goto LAB_00132461;
                }
                if (uVar16 < 10000) goto LAB_00132461;
                uVar22 = uVar22 / 10000;
                uVar12 = __len + 4;
              } while (99999 < uVar16);
              __len = __len + 1;
            }
LAB_00132461:
            local_8c = local_150.x;
            local_118 = (undefined1  [8])&local_108;
            std::__cxx11::string::_M_construct
                      ((ulong)local_118,(char)__len - (char)((int)uVar31 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar31 >> 0x1f) + (long)local_118),__len,uVar17);
            IVar6 = ImGui::CalcTextSize((char *)local_118,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc_00;
            local_58._0_4_ = IVar6.x;
            local_58._4_4_ = IVar6.y;
            local_58._12_4_ = extraout_XMM0_Dd_00;
            local_90 = local_150.y;
            local_94 = local_158.y;
            fVar36 = ImGui::GetTextLineHeightWithSpacing();
            local_a0.y = (local_90 + local_94) - fVar36;
            local_a0.x = ((local_c0._0_4_ + local_b0._0_4_) * local_120 - (float)local_58._0_4_) *
                         0.5 + local_8c;
            ImGui::SetCursorScreenPos(&local_a0);
            pIVar20 = local_a8;
            piVar33 = local_140;
            if (local_118 != (undefined1  [8])&local_108) {
              operator_delete((void *)local_118,local_108 + 1);
            }
            ImGui::Text("%d",(ulong)uVar31);
            uVar17 = *piVar33;
          }
          local_138.x = ((float)((g_playbackData.idx + g_playbackData.offset) - (long)*local_e0) /
                        (float)(int)uVar17) * local_158.x + local_150.x;
          local_138.y = local_150.y;
          local_148.y = local_150.y + local_158.y;
          local_148.x = local_138.x;
          local_118._0_4_ = 1.0;
          local_118._4_4_ = 1.0;
          iStack_110 = 0x3e99999a00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
          ImDrawList::AddLine(pIVar20,(ImVec2 *)&local_138,&local_148,IVar15,1.0);
          psVar19 = (pTVar11->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar24 = (pTVar11->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar31 = uVar31 + 1;
        iVar14 = (int)((ulong)((long)psVar24 - (long)psVar19) >> 4);
        iVar25 = iVar14 * -0x55555555;
      } while (SBORROW4(uVar31,iVar25) != (int)(uVar31 + iVar14 * 0x55555555) < 0);
      if (0 < iVar25) {
        lVar23 = 0x10;
        lVar29 = 0;
        do {
          local_138.x = ((float)*(long *)((long)&(psVar19->waveform).samples + lVar23) /
                        (float)stateUI->viewMax) * local_158.x + local_150.x;
          local_138.y = local_150.y + local_158.y;
          local_148.y = local_150.y + local_158.y + stateUI->scrollSize;
          local_148.x = local_138.x;
          local_118._0_4_ = 1.0;
          local_118._4_4_ = 0.0;
          iStack_110 = 0x3e99999a00000000;
          IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
          ImDrawList::AddLine(pIVar20,(ImVec2 *)&local_138,&local_148,IVar15,1.0);
          lVar29 = lVar29 + 1;
          psVar19 = (pTVar11->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar23 = lVar23 + 0x30;
        } while (lVar29 < (int)((ulong)((long)(pTVar11->
                                              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                              ).
                                              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)psVar19) >> 4) * -0x55555555);
      }
    }
    ImGui::SetCursorScreenPos(&local_68);
    ImGui::PushItemWidth(100.0);
    pIVar27 = local_b8;
    if (stateUI->recording == false) {
      if (stateUI->audioCapture == true) {
        local_118._0_4_ = 0.0;
        local_118._4_4_ = 0.0;
        bVar13 = ImGui::Button("   Record",(ImVec2 *)local_118);
        if ((bVar13) &&
           ((ulong)((long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>.
                         _M_impl.super__Vector_impl_data._M_start) < 0x57e400)) {
          AudioLogger::resume(&audioLogger);
          stateUI->recording = true;
          LOCK();
          g_doRecord._M_base._M_i = (__atomic_base<bool>)true;
          UNLOCK();
        }
        local_138._0_8_ = ImGui::GetCursorScreenPos();
        local_d8._8_4_ = extraout_XMM0_Dc_02;
        local_d8._0_4_ = local_138.x;
        local_d8._4_4_ = local_138.y;
        local_d8._12_4_ = extraout_XMM0_Dd_02;
        IVar6 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
        local_148.x = IVar6.x * 0.9 + (float)local_d8._0_4_;
        fVar36 = ImGui::GetFrameHeightWithSpacing();
        local_148.y = fVar36 * -0.56 + (float)local_d8._4_4_;
        pIVar20 = ImGui::GetWindowDrawList();
        local_118._0_4_ = 1.0;
        local_118._4_4_ = 0.0;
        iStack_110 = 0x3f80000000000000;
        IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
        ImDrawList::AddCircleFilled(pIVar20,&local_148,6.0,IVar15,0xc);
        ImGui::SetCursorScreenPos((ImVec2 *)&local_138);
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::Checkbox("x0.5",&renderKeyPresses::playHalfSpeed);
      ImGui::SameLine(0.0,-1.0);
      if (g_playbackData.playing == true) {
        local_118._0_4_ = 0.0;
        local_118._4_4_ = 0.0;
        bVar13 = ImGui::Button("Stop",(ImVec2 *)local_118);
        if ((bVar13) ||
           ((bVar13 = ImGui::IsKeyPressed(0x2c,true), bVar13 &&
            (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)))) {
          g_playbackData.playing = false;
          g_playbackData.idx = g_playbackData.waveform.n + -0x400;
        }
      }
      else {
        local_118._0_4_ = 0.0;
        local_118._4_4_ = 0.0;
        bVar13 = ImGui::Button("Play",(ImVec2 *)local_118);
        piVar34 = local_e0;
        piVar33 = local_140;
        if ((bVar13) ||
           ((bVar13 = ImGui::IsKeyPressed(0x2c,true), piVar34 = local_e0, piVar33 = local_140,
            bVar13 && (pIVar18 = ImGui::GetIO(), pIVar18->KeyCtrl != false)))) {
          g_playbackData.playing = true;
          g_playbackData.slowDown = renderKeyPresses::playHalfSpeed + 1;
          g_playbackData.idx = 0;
          g_playbackData.offset = (int64_t)*piVar34;
          uVar31 = 160000;
          if (*piVar33 < 160000) {
            uVar31 = *piVar33;
          }
          g_playbackData.waveform.samples = (short *)(g_playbackData.offset * 2 + (long)*pIVar27);
          g_playbackData.waveform.n = (int64_t)(int)uVar31;
          SDL_PauseAudioDevice(g_deviceIdOut,0);
        }
      }
      if (g_playbackData.waveform.n + -0x200 <= g_playbackData.idx) {
        g_playbackData.playing = false;
        SDL_ClearQueuedAudio(g_deviceIdOut);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
      ImGui::SameLine(0.0,-1.0);
      bVar13 = ImGui::SliderFloat("Threshold background",&renderKeyPresses::thresholdBackground,0.1,
                                  50.0,"%.3f",1.0);
      if (bVar13) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar13 = ImGui::SliderInt("History Size",&renderKeyPresses::historySize,0x200,0x4000,"%d");
      if (bVar13) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      local_118._0_4_ = 0.0;
      local_118._4_4_ = 0.0;
      bVar13 = ImGui::Button("Recalculate",(ImVec2 *)local_118);
      if (bVar13) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Key width",&(stateUI->params).keyPressWidth_samples,8.0,0,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Peak offset",&(stateUI->params).offsetFromPeak_samples,8.0,-0x640,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Align window",&(stateUI->params).alignWindow_samples,8.0,0,0x640,"%d");
      ImGui::PopItemWidth();
    }
    else {
      if (((byte)g_doRecord._M_base._M_i & 1) != 0) {
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        AudioLogger::record(&audioLogger,0.2,0);
      }
      local_118._0_4_ = 0.0;
      local_118._4_4_ = 0.0;
      bVar13 = ImGui::Button("   Stop Recording",(ImVec2 *)local_118);
      if (bVar13) {
        AudioLogger::pause(&audioLogger);
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        stateUI->recalculateKeyPresses = true;
        stateUI->lastSize = stateUI->lastSize + -1;
        stateUI->recording = false;
        stateUI->rescaleWaveform = true;
      }
      local_138._0_8_ = ImGui::GetCursorScreenPos();
      local_d8._8_4_ = extraout_XMM0_Dc_01;
      local_d8._0_4_ = local_138.x;
      local_d8._4_4_ = local_138.y;
      local_d8._12_4_ = extraout_XMM0_Dd_01;
      IVar6 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
      local_148.x = IVar6.x * 0.9 + (float)local_d8._0_4_;
      fVar36 = ImGui::GetFrameHeightWithSpacing();
      fVar36 = fVar36 * -0.56 + (float)local_d8._4_4_;
      IVar7.y = fVar36 + -4.0;
      IVar7.x = local_148.x + -4.0;
      local_a0.y = fVar36 + 4.0;
      local_a0.x = local_148.x + 4.0;
      local_148 = IVar7;
      pIVar20 = ImGui::GetWindowDrawList();
      local_118._0_4_ = 1.0;
      local_118._4_4_ = 1.0;
      iStack_110 = 0x3f8000003f800000;
      IVar15 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_118);
      ImDrawList::AddRectFilled(pIVar20,&local_148,&local_a0,IVar15,0.0,0xf);
      ImGui::SetCursorScreenPos((ImVec2 *)&local_138);
      ImGui::SameLine(0.0,-1.0);
      pIVar27 = local_b8;
      ImGui::Text("Record length: %4.2f s (max : %4.2f s)",
                  SUB84((double)((float)(ulong)((long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 1) /
                                16000.0),0),0);
    }
    if (stateUI->recalculateKeyPresses == true) {
      local_118 = *(undefined1 (*) [8])pIVar27;
      iStack_110 = (long)pIVar27[1] - (long)local_118 >> 1;
      findKeyPresses<short>
                ((TWaveformViewT<short> *)local_118,pTVar11,&stateUI->waveformThreshold,
                 &stateUI->waveformMax,(double)renderKeyPresses::thresholdBackground,0x200,
                 renderKeyPresses::historySize,true);
      stateUI->recalculateKeyPresses = false;
    }
    fVar36 = ImGui::GetWindowHeight();
  }
  else {
    fVar36 = ImGui::GetTextLineHeightWithSpacing();
  }
  stateUI->windowHeightKeyPesses = fVar36;
  ImGui::End();
  return false;
}

Assistant:

bool renderKeyPresses(stStateUI & stateUI, const TWaveform & waveform, TKeyPressCollection & keyPresses) {
    auto & params = stateUI.params;

    bool & scrolling = stateUI.scrolling;
    bool & recalculateKeyPresses = stateUI.recalculateKeyPresses;

    int & nview = stateUI.nview;
    int & viewMin = stateUI.viewMin;
    int & viewMax = stateUI.viewMax;
    int & offset = stateUI.offset;
    int & lastSize = stateUI.lastSize;
    int & lastKeyPresses = stateUI.lastKeyPresses;

    float & amin = stateUI.amin;
    float & amax = stateUI.amax;

    float & dragOffset = stateUI.dragOffset;
    float & scrollSize = stateUI.scrollSize;

    auto & nviewPrev = stateUI.nviewPrev;

    TWaveform & waveformLowRes = stateUI.waveformLowRes;
    TWaveform & waveformThreshold = stateUI.waveformThreshold;
    TWaveform & waveformMax = stateUI.waveformMax;

    if (nview < 0) nview = waveform.size();
    if (offset < 0) offset = (waveform.size() - nview)/2;

    if (stateUI.recording) {
        if (nview < 1024*kSamplesPerFrame && scrolling == false) {
            nview = std::min((int) (1024*kSamplesPerFrame), (int) waveform.size());
        }
    }

    if (lastSize != (int) waveform.size()) {
        viewMax = waveform.size();
        lastSize = waveform.size();
        nviewPrev = nview + 1;

        if (scrolling == false) {
            offset = waveform.size() - nview;
        }
    }

#ifndef __EMSCRIPTEN__
    if ((int) keyPresses.size() >= lastKeyPresses + 10) {
        lastKeyPresses = keyPresses.size();

        stateUI.similarityMap.clear();
        stateUI.flags.recalculateSimilarityMap = true;
        stateUI.doUpdate = true;
    }
#endif

    ImGui::SetNextWindowPos(ImVec2(0, stateUI.windowHeightTitleBar), ImGuiCond_Once);
    if (stateUI.windowHeightKeyPesses == 0.0f) {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, 250.0f), ImGuiCond_Always);
    } else {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, stateUI.windowHeightKeyPesses), ImGuiCond_Always);
    }
    if (ImGui::Begin("Key Presses", nullptr, ImGuiWindowFlags_NoMove)) {
        bool ignoreDelete = false;

        auto wsize = ImVec2(ImGui::GetContentRegionAvailWidth(), ImGui::GetContentRegionAvail().y - 3*ImGui::GetTextLineHeightWithSpacing());

        if (nview != nviewPrev) {
            generateLowResWaveform(waveform, waveformLowRes, std::max(1.0f, nview/wsize.x));
            nviewPrev = nview;
        }

        auto wview = getView(waveformLowRes, offset, nview);

        auto mpos = ImGui::GetIO().MousePos;
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.3f, 0.3f, 0.3f, 0.3f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveform, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);
        ImGui::SetCursorScreenPos(savePos);
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.1f, 0.1f, 0.1f, 0.0f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveformInverse, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);

        if (waveform.size() == waveformThreshold.size() && waveform.size() == waveformMax.size()) {
            auto tview = getView(waveformThreshold, offset, nview);
            auto mview = getView(waveformMax, offset, nview);

            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveform, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveformInverse, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveform, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveformInverse, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
        }
        ImGui::SetCursorScreenPos(savePos);

        ImGui::InvisibleButton("##WaveformIB",wsize);
        if (ImGui::IsItemHovered()) {
            auto w = ImGui::GetIO().MouseWheel;
            auto nview_old = nview;
            nview *= (10.0 + w)/10.0;
            nview = std::min(std::max(viewMin, nview), viewMax);
            if (w != 0.0) {
                offset = std::max(0.0f, offset + ((mpos.x - savePos.x)/wsize.x)*(nview_old - nview));
            }

            if (ImGui::IsMouseDown(0) && ImGui::IsMouseDragging(0) == false) {
                dragOffset = offset;
            }

            if (ImGui::IsMouseDragging(0)) {
                offset = dragOffset - ImGui::GetMouseDragDelta(0).x*nview/wsize.x;
            }

            if ((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) {
                int i = 0;
                int64_t pos = offset + nview*(mpos.x - savePos.x)/wsize.x;
                for (i = 0; i < (int) keyPresses.size(); ++i) {
                    int64_t p0 = keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples;
                    int64_t p1 = keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples;
                    int64_t pmin = std::min(std::min(keyPresses[i].pos, p0), p1);
                    int64_t pmax = std::max(std::max(keyPresses[i].pos, p0), p1);
                    if (pmin > pos) {
                        ignoreDelete = true;
                        TKeyPressData entry;
                        entry.pos = pos;
                        entry.waveform = getView(waveform, 0);
                        keyPresses.insert(keyPresses.begin() + i, entry);
                        break;
                    }
                    if (pos >= pmin && pos <= pmax) break;
                }
                if (i == (int) keyPresses.size() && ignoreDelete == false) {
                    ignoreDelete = true;
                    TKeyPressData entry;
                    entry.pos = pos;
                    entry.waveform = getView(waveform, 0);
                    keyPresses.push_back(entry);
                }
            }
        }
        if (ImGui::BeginPopupContextWindow()) {
            ImGui::SliderInt("View  ", &nview, viewMin, viewMax);
            ImGui::DragInt  ("Offset", &offset, 0.01*nview, 0, waveform.size() - nview);
            ImGui::SliderFloat("Amplitude Min", &amin, -32000, 0);
            ImGui::SliderFloat("Amplitude Max", &amax, 0, 32000);
            ImGui::EndPopup();
        }

        ImGui::InvisibleButton("##WaveformScrollIB", {wsize.x, scrollSize});
        drawList->AddRect({savePos.x, savePos.y + wsize.y}, {savePos.x + wsize.x, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));
        drawList->AddRectFilled({savePos.x + wsize.x*(1.f*offset)/viewMax, savePos.y + wsize.y}, {savePos.x + wsize.x*(1.f*offset + nview)/viewMax, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));

        auto savePos2 = ImGui::GetCursorScreenPos();

        if (ImGui::IsItemHovered()) {
            if (ImGui::IsMouseDown(0)) {
                scrolling = true;
            }
        }

        if (scrolling) {
            offset = ((mpos.x - savePos.x)/wsize.x)*viewMax - nview/2;
        }

        if (ImGui::IsMouseDown(0) == false) {
            scrolling = false;
        }

        offset = std::max(0, std::min((int) offset, (int) waveform.size() - nview));
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            if (keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples < offset) continue;
            if (keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples >= offset + nview) break;

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.8f }), 1.0f);
            }

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;
                float x1 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples - offset))/nview;
                float x2 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x1*wsize.x, savePos.y };
                ImVec2 p2 = { savePos.x + x2*wsize.x, savePos.y + wsize.y };

                float xmin = std::min(std::min(p0.x, p1.x), p2.x);
                float xmax = std::max(std::max(p0.x, p1.x), p2.x);

                bool isHovered = (mpos.x > xmin && mpos.x < xmax && mpos.y > p1.y && mpos.y < p2.y);

                float col = isHovered ? 0.7f : 0.3f;
                drawList->AddRectFilled(p1, p2, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, col }));

                if (isHovered) {
                    if (((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) && ignoreDelete == false) {
                        keyPresses.erase(keyPresses.begin() + i);
                        --i;
                    }
                }

                if (nview < 64.0*wsize.x) {
                    ImGui::SetCursorScreenPos({ savePos.x + 0.5f*((x1 + x2)*wsize.x - ImGui::CalcTextSize(std::to_string(i).c_str()).x), savePos.y + wsize.y - ImGui::GetTextLineHeightWithSpacing() });
                    ImGui::Text("%d", i);
                }

            }

            {
                float x0 = ((float)(g_playbackData.offset + g_playbackData.idx - offset))/nview;

                ImVec2 p0 = {savePos.x + x0*wsize.x, savePos.y};
                ImVec2 p1 = {savePos.x + x0*wsize.x, savePos.y + wsize.y};
                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 0.0f, 0.3f }));
            }
        }
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            {
                float x0 = ((float)(keyPresses[i].pos))/viewMax;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y + scrollSize };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.3f }));
            }
        }

        ImGui::SetCursorScreenPos(savePos2);

        //auto io = ImGui::GetIO();
        //ImGui::Text("Keys pressed:");   for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); i++) if (ImGui::IsKeyPressed(i))             { ImGui::SameLine(); ImGui::Text("%d", i); }

        static bool playHalfSpeed = false;
        static int historySize = 2*1024;
        static float thresholdBackground = 8.0;
        ImGui::PushItemWidth(100.0);

        if (stateUI.recording == false) {
            if (stateUI.audioCapture) {
                if (ImGui::Button("   Record")) {
                    if (float(stateUI.waveformInput.size()/kSampleRate) < kMaxRecordSize_s) {
                        audioLogger.resume();
                        stateUI.recording = true;
                        g_doRecord = true;
                    }
                }
                {
                    auto savePos = ImGui::GetCursorScreenPos();
                    auto p = savePos;
                    p.x += 0.90f*ImGui::CalcTextSize("  ").x;
                    p.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();
                    ImGui::GetWindowDrawList()->AddCircleFilled(p, 6.0, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 1.0f }));
                    ImGui::SetCursorScreenPos(savePos);
                }

                ImGui::SameLine();
            }

            ImGui::Checkbox("x0.5", &playHalfSpeed);
            ImGui::SameLine();
            if (g_playbackData.playing) {
                if (ImGui::Button("Stop") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = false;
                    g_playbackData.idx = g_playbackData.waveform.n - TPlaybackData::kSamples;
                }
            } else {
                if (ImGui::Button("Play") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = true;
                    g_playbackData.slowDown = playHalfSpeed ? 2 : 1;
                    g_playbackData.idx = 0;
                    g_playbackData.offset = offset;
                    g_playbackData.waveform = getView(waveform, offset, std::min((int) (10*kSampleRate), nview));
                    SDL_PauseAudioDevice(g_deviceIdOut, 0);
                }
            }

            if (g_playbackData.idx >= g_playbackData.waveform.n - kSamplesPerFrame) {
                g_playbackData.playing = false;
                SDL_ClearQueuedAudio(g_deviceIdOut);
#ifndef __EMSCRIPTEN__
                SDL_PauseAudioDevice(g_deviceIdOut, 1);
#endif
            }

            ImGui::SameLine();
            ImGui::SliderFloat("Threshold background", &thresholdBackground, 0.1f, 50.0f) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            ImGui::SliderInt("History Size", &historySize, 512, 1024*16) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            if (ImGui::Button("Recalculate")) {
                recalculateKeyPresses = true;
            }

            ImGui::SameLine();
            ImGui::DragInt("Key width", &params.keyPressWidth_samples, 8, 0, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Peak offset", &params.offsetFromPeak_samples, 8, -kSampleRate/10, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Align window", &params.alignWindow_samples, 8, 0, kSampleRate/10);

            ImGui::PopItemWidth();
        } else {
            if (g_doRecord) {
                g_doRecord = false;
                audioLogger.record(0.2f, 0);
            }

            if (ImGui::Button("   Stop Recording")) {
                audioLogger.pause();
                g_doRecord = false;

                stateUI.recalculateKeyPresses = true;
                stateUI.lastSize = stateUI.lastSize - 1;
                stateUI.recording = false;
                stateUI.rescaleWaveform = true;
            }
            {
                auto savePos = ImGui::GetCursorScreenPos();
                auto p0 = savePos;
                p0.x += 0.90f*ImGui::CalcTextSize("  ").x;
                p0.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();

                auto p1 = p0;
                p0.x -= 4.0f;
                p0.y -= 4.0f;
                p1.x += 4.0f;
                p1.y += 4.0f;

                ImGui::GetWindowDrawList()->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 1.0f, 1.0f }));
                ImGui::SetCursorScreenPos(savePos);
            }

            ImGui::SameLine();
            ImGui::Text("Record length: %4.2f s (max : %4.2f s)", (float)(stateUI.waveformInput.size())/kSampleRate, kMaxRecordSize_s);
        }

        if (recalculateKeyPresses) {
            findKeyPresses(getView(waveform, 0), keyPresses, waveformThreshold, waveformMax, thresholdBackground, 512, historySize, true);
            recalculateKeyPresses = false;
        }

        stateUI.windowHeightKeyPesses = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightKeyPesses = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();

    return false;
}